

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui_qprintpropertieswidget.h
# Opt level: O0

void __thiscall
Ui_QPrintPropertiesWidget::retranslateUi
          (Ui_QPrintPropertiesWidget *this,QWidget *QPrintPropertiesWidget)

{
  QWidget *pQVar1;
  QString *pQVar2;
  uint uVar3;
  QString *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  char local_68 [24];
  char local_50 [24];
  char local_38 [24];
  char local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QCoreApplication::translate(local_20,"QPrintPropertiesWidget","Form",0);
  QWidget::setWindowTitle(in_RSI);
  QString::~QString((QString *)0x178f7a);
  pQVar1 = *(QWidget **)(in_RDI + 8);
  uVar3 = QTabWidget::indexOf(pQVar1);
  QCoreApplication::translate(local_38,"QPrintPropertiesWidget","Page",0);
  QTabWidget::setTabText((int)pQVar1,(QString *)(ulong)uVar3);
  QString::~QString((QString *)0x178fda);
  pQVar1 = *(QWidget **)(in_RDI + 8);
  uVar3 = QTabWidget::indexOf(pQVar1);
  QCoreApplication::translate(local_50,"QPrintPropertiesWidget","Advanced",0);
  QTabWidget::setTabText((int)pQVar1,(QString *)(ulong)uVar3);
  QString::~QString((QString *)0x17903a);
  pQVar2 = *(QString **)(in_RDI + 0x50);
  QCoreApplication::translate
            (local_68,"QPrintPropertiesWidget",
             "There are conflicts in some options. Please fix them.",0);
  QLabel::setText(pQVar2);
  QString::~QString((QString *)0x179089);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void retranslateUi(QWidget *QPrintPropertiesWidget)
    {
        QPrintPropertiesWidget->setWindowTitle(QCoreApplication::translate("QPrintPropertiesWidget", "Form", nullptr));
        tabs->setTabText(tabs->indexOf(tabPage), QCoreApplication::translate("QPrintPropertiesWidget", "Page", nullptr));
        tabs->setTabText(tabs->indexOf(cupsPropertiesPage), QCoreApplication::translate("QPrintPropertiesWidget", "Advanced", nullptr));
        conflictsLabel->setText(QCoreApplication::translate("QPrintPropertiesWidget", "There are conflicts in some options. Please fix them.", nullptr));
    }